

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O1

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  int *piVar1;
  size_t sVar2;
  size_t sVar3;
  Allocator *pAVar4;
  pointer pfVar5;
  int *piVar6;
  undefined1 uVar7;
  char cVar8;
  float fVar9;
  uint uVar10;
  float fVar11;
  ulong uVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  undefined1 *puVar16;
  char *pcVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  float fVar22;
  void *pvVar23;
  long lVar24;
  char *pcVar25;
  int n_1;
  void *pvVar26;
  long lVar27;
  undefined4 *puVar28;
  int iVar29;
  void *pvVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  void *pvVar34;
  uint uVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  undefined1 *puVar39;
  void *pvVar40;
  char *pcVar41;
  long lVar42;
  void *pvVar43;
  int p;
  undefined1 *puVar44;
  ulong uVar45;
  undefined1 *puVar46;
  char *ret;
  undefined4 uVar47;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar48 [12];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined4 uVar53;
  undefined4 uVar54;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  float local_1dc;
  undefined8 local_1d8;
  float fStack_1d0;
  float fStack_1cc;
  ulong local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined4 uStack_18c;
  ulong local_180;
  void *local_178;
  ulong local_170;
  undefined8 local_168;
  uint local_150;
  float local_14c;
  undefined1 local_148 [16];
  undefined8 local_138;
  float fStack_130;
  float fStack_12c;
  int *local_128;
  int *local_120;
  void *local_118;
  char *local_110;
  undefined8 local_108;
  float fStack_100;
  float fStack_fc;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  Allocator *local_d0;
  Allocator *local_c8;
  void *local_c0;
  ulong local_b8;
  undefined1 *local_b0;
  int local_a8 [12];
  int *local_78;
  ulong local_70;
  Mat *local_68;
  ulong local_60;
  char *local_58;
  undefined1 *local_50;
  Allocator *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar12 = (ulong)(uint)stride_w;
  local_1d8 = (undefined1 *)(ulong)(uint)bottom_blob->c;
  local_f8 = _kernel->data;
  local_c0 = _bias->data;
  local_1b8 = (ulong)(uint)(kernel_h * kernel_w);
  uVar18 = bottom_blob->c * kernel_h * kernel_w;
  local_138 = CONCAT44(local_138._4_4_,top_blob->h);
  local_168 = (void *)CONCAT44(local_168._4_4_,top_blob->w);
  fVar9 = (float)(top_blob->h * top_blob->w);
  uVar35 = bottom_blob->w;
  local_180 = (ulong)top_blob->c;
  local_d0 = opt->workspace_allocator;
  local_68 = top_blob;
  if ((int)fVar9 * uVar18 == 0) {
    local_120 = (int *)0x0;
    pvVar13 = (void *)0x0;
  }
  else {
    local_198 = CONCAT44(local_198._4_4_,stride_w);
    uVar12 = (long)(int)((int)fVar9 * uVar18) + 3U & 0xfffffffffffffffc;
    if (local_d0 == (Allocator *)0x0) {
      local_1f8 = (void *)0x0;
      iVar20 = posix_memalign((void **)&local_1f8,0x10,uVar12 + 4);
      pvVar13 = local_1f8;
      if (iVar20 != 0) {
        local_1f8 = (void *)0x0;
        pvVar13 = local_1f8;
      }
    }
    else {
      pvVar13 = (void *)(**(code **)(*(long *)local_d0 + 0x10))();
    }
    local_120 = (int *)((long)pvVar13 + uVar12);
    *(undefined4 *)((long)pvVar13 + uVar12) = 1;
    uVar12 = local_198 & 0xffffffff;
  }
  if (0 < (int)(float)local_138) {
    local_108 = (ulong)(stride_h * uVar35);
    local_1a8._0_8_ = uVar12;
    lVar38 = 0;
    iVar31 = 0;
    iVar20 = 0;
    do {
      local_148._0_4_ = iVar20;
      local_e8._0_8_ = lVar38;
      if (0 < (int)(float)local_168) {
        iVar19 = 0;
        lVar37 = lVar38;
        do {
          local_198 = CONCAT44(local_198._4_4_,iVar19);
          if (0 < (int)(float)local_1d8) {
            puVar44 = (undefined1 *)0x0;
            do {
              if (0 < kernel_h) {
                sVar2 = bottom_blob->cstep;
                sVar3 = bottom_blob->elemsize;
                pvVar14 = bottom_blob->data;
                iVar29 = 0;
                lVar42 = lVar37;
                do {
                  if (0 < kernel_w) {
                    uVar45 = 0;
                    do {
                      *(undefined1 *)((long)pvVar13 + uVar45 + (long)iVar31) =
                           *(undefined1 *)
                            ((long)pvVar14 +
                            (long)((int)lVar42 + (int)uVar45) + sVar2 * (long)puVar44 * sVar3);
                      uVar45 = uVar45 + 1;
                    } while ((uint)kernel_w != uVar45);
                    iVar31 = iVar31 + (int)uVar45;
                  }
                  iVar29 = iVar29 + 1;
                  lVar42 = lVar42 + (ulong)uVar35;
                } while (iVar29 != kernel_h);
              }
              puVar44 = puVar44 + 1;
            } while (puVar44 != local_1d8);
          }
          iVar19 = iVar19 + 1;
          lVar37 = lVar37 + uVar12;
        } while ((float)iVar19 != (float)local_168);
      }
      iVar20 = iVar20 + 1;
      lVar38 = lVar38 + local_108;
    } while ((float)iVar20 != (float)local_138);
  }
  iVar20 = (int)local_1b8 * 4;
  fVar22 = (float)((int)fVar9 + 3);
  if (-1 < (int)fVar9) {
    fVar22 = fVar9;
  }
  local_c8 = opt->workspace_allocator;
  local_e8._0_4_ = (int)(float)local_1d8 * iVar20;
  local_1c0 = (long)(int)local_e8._0_4_ + 0xfU & 0xfffffffffffffff0;
  uVar12 = (long)((int)fVar9 + ((int)fVar22 >> 2) * -3) * local_1c0;
  local_1b0 = CONCAT44(local_1b0._4_4_,iVar20);
  local_118 = pvVar13;
  if (uVar12 == 0) {
    local_128 = (int *)0x0;
    pvVar14 = (void *)0x0;
  }
  else {
    if (local_c8 == (Allocator *)0x0) {
      local_1f8 = (void *)0x0;
      iVar20 = posix_memalign((void **)&local_1f8,0x10,uVar12 | 4);
      pvVar14 = local_1f8;
      if (iVar20 != 0) {
        local_1f8 = (void *)0x0;
        pvVar14 = local_1f8;
      }
    }
    else {
      pvVar14 = (void *)(**(code **)(*(long *)local_c8 + 0x10))(local_c8,uVar12 | 4);
    }
    local_128 = (int *)((long)pvVar14 + uVar12);
    *(undefined4 *)((long)pvVar14 + uVar12) = 1;
  }
  local_1dc = (float)((uint)fVar9 & 0xfffffffc);
  local_1a8._0_8_ = SEXT48((int)uVar18);
  if (0 < (int)fVar9 >> 2) {
    local_108 = CONCAT44(local_108._4_4_,uVar18) & 0xfffffffffffffffe;
    uVar45 = CONCAT44(0,(int)fVar9 >> 2);
    local_148._0_8_ = uVar45;
    local_138 = local_1a8._0_8_ * 4;
    lVar38 = (long)pvVar13 + local_1a8._0_8_;
    pvVar40 = (void *)((long)pvVar13 + local_1a8._0_8_ * 2);
    pvVar43 = (void *)(local_1a8._0_8_ * 3 + (long)pvVar13);
    pvVar23 = pvVar13;
    uVar12 = 0;
    pvVar26 = pvVar14;
    do {
      local_168 = pvVar26;
      local_198 = uVar12;
      puVar44 = (undefined1 *)(local_1c0 * local_198 + (long)pvVar14);
      if ((int)uVar18 < 2) {
        pvVar26 = (void *)(local_198 * 4 * local_1a8._0_8_ + (long)pvVar13);
        pvVar15 = (void *)((local_198 * 4 + 1) * local_1a8._0_8_ + (long)pvVar13);
        pvVar34 = (void *)((local_198 * 4 + 2) * local_1a8._0_8_ + (long)pvVar13);
        pvVar30 = (void *)((local_198 * 4 + 3) * local_1a8._0_8_ + (long)pvVar13);
        iVar20 = 0;
      }
      else {
        lVar37 = 0;
        do {
          puVar39 = puVar44;
          puVar44 = (undefined1 *)((long)local_168 + lVar37 * 4);
          *puVar44 = *(undefined1 *)((long)pvVar23 + lVar37);
          puVar44[1] = *(undefined1 *)((long)pvVar23 + lVar37 + 1);
          puVar44[2] = *(undefined1 *)(lVar38 + lVar37);
          puVar44[3] = *(undefined1 *)(lVar38 + 1 + lVar37);
          puVar44[4] = *(undefined1 *)((long)pvVar40 + lVar37);
          puVar44[5] = *(undefined1 *)((long)pvVar40 + lVar37 + 1);
          puVar44[6] = *(undefined1 *)((long)pvVar43 + lVar37);
          puVar44[7] = *(undefined1 *)((long)pvVar43 + lVar37 + 1);
          lVar42 = lVar37 + 2;
          iVar20 = (int)lVar37;
          puVar44 = puVar44 + 8;
          lVar37 = lVar42;
        } while (iVar20 + 3 < (int)uVar18);
        puVar44 = puVar39 + 8;
        pvVar26 = (void *)((long)pvVar23 + lVar42);
        pvVar15 = (void *)(lVar38 + lVar42);
        pvVar34 = (void *)((long)pvVar40 + lVar42);
        pvVar30 = (void *)(lVar42 + (long)pvVar43);
        iVar20 = (int)(float)local_108;
      }
      if (iVar20 < (int)uVar18) {
        lVar37 = 0;
        do {
          puVar44[lVar37 * 4] = *(undefined1 *)((long)pvVar26 + lVar37);
          puVar44[lVar37 * 4 + 1] = *(undefined1 *)((long)pvVar15 + lVar37);
          puVar44[lVar37 * 4 + 2] = *(undefined1 *)((long)pvVar34 + lVar37);
          puVar44[lVar37 * 4 + 3] = *(undefined1 *)((long)pvVar30 + lVar37);
          lVar37 = lVar37 + 1;
        } while (uVar18 - iVar20 != (int)lVar37);
      }
      pvVar23 = (void *)((long)pvVar23 + local_138);
      lVar38 = lVar38 + local_138;
      pvVar40 = (void *)((long)pvVar40 + local_138);
      pvVar43 = (void *)((long)pvVar43 + local_138);
      uVar12 = local_198 + 1;
      pvVar26 = (void *)((long)local_168 + local_1c0);
    } while (local_198 + 1 != uVar45);
  }
  if (local_1dc != fVar9) {
    lVar38 = (long)(int)local_1dc;
    do {
      puVar44 = (undefined1 *)(lVar38 * local_1a8._0_8_ + (long)pvVar13);
      uVar35 = (uint)lVar38;
      uVar10 = uVar35 + 3;
      if (-1 < (int)uVar35) {
        uVar10 = uVar35;
      }
      puVar39 = (undefined1 *)
                ((long)(int)(((int)uVar10 >> 2) + (uVar35 - (uVar10 & 0xfffffffc))) * local_1c0 +
                (long)pvVar14);
      if ((int)uVar18 < 2) {
        uVar35 = 0;
      }
      else {
        iVar20 = 1;
        do {
          *puVar39 = *puVar44;
          puVar39[1] = puVar44[1];
          puVar39 = puVar39 + 2;
          puVar44 = puVar44 + 2;
          iVar20 = iVar20 + 2;
          uVar35 = uVar18 & 0xfffffffe;
        } while (iVar20 < (int)uVar18);
      }
      if ((int)uVar35 < (int)uVar18) {
        lVar37 = 0;
        do {
          puVar39[lVar37] = puVar44[lVar37];
          lVar37 = lVar37 + 1;
        } while (uVar18 - uVar35 != (int)lVar37);
      }
      lVar38 = lVar38 + 1;
    } while (lVar38 < (int)fVar9);
  }
  uVar35 = (uint)local_180;
  uVar10 = uVar35 + 3;
  if (-1 < (int)uVar35) {
    uVar10 = uVar35;
  }
  uVar21 = uVar35 + 3;
  if (-1 < (int)uVar35) {
    uVar21 = uVar35;
  }
  pAVar4 = opt->workspace_allocator;
  local_170 = (long)((int)(float)local_1b0 * (int)(float)local_1d8) + 0xfU & 0xfffffffffffffff0;
  uVar12 = (long)(int)((uVar35 - (uVar21 & 0xfffffffc)) + ((int)uVar10 >> 2)) * local_170;
  if (uVar12 == 0) {
    local_178 = (void *)0x0;
    local_78 = (int *)0x0;
  }
  else {
    if (pAVar4 == (Allocator *)0x0) {
      local_1f8 = (void *)0x0;
      iVar20 = posix_memalign((void **)&local_1f8,0x10,uVar12 | 4);
      local_178 = local_1f8;
      if (iVar20 != 0) {
        local_1f8 = (void *)0x0;
        local_178 = local_1f8;
      }
    }
    else {
      local_178 = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,uVar12 | 4);
    }
    local_78 = (int *)(uVar12 + (long)local_178);
    *(undefined4 *)((long)local_178 + uVar12) = 1;
  }
  fVar22 = (float)((int)local_180 >> 2);
  local_70 = local_180 & 0xfffffffffffffffc;
  local_60 = (ulong)(uint)fVar22;
  iVar20 = (int)local_1d8;
  if (0 < (int)fVar22) {
    iVar29 = iVar20 * (int)(float)local_1b8;
    local_168 = (void *)CONCAT44(local_168._4_4_,iVar29);
    local_1a8._0_4_ = uVar18 & 0xfffffffe;
    iVar19 = kernel_h * iVar20 * kernel_w;
    iVar31 = iVar19 * 3;
    iVar19 = iVar19 * 2;
    iVar32 = 0;
    uVar12 = 0;
    pvVar40 = local_178;
    uVar35 = uVar18;
    do {
      puVar44 = (undefined1 *)(local_170 * uVar12 + (long)local_178);
      local_198 = CONCAT44(local_198._4_4_,iVar31);
      if ((int)uVar18 < 2) {
        iVar33 = (int)uVar12;
        lVar38 = (long)((iVar33 * 4 + 3) * iVar29);
        lVar37 = (long)((iVar33 * 4 + 2) * iVar29);
        lVar42 = (long)((iVar33 * 4 + 1) * iVar29);
        lVar24 = (long)(iVar33 * 4 * iVar29);
        uVar10 = 0;
      }
      else {
        lVar38 = 0;
        do {
          puVar39 = puVar44;
          puVar44 = (undefined1 *)((long)pvVar40 + lVar38 * 4);
          *puVar44 = *(undefined1 *)((long)local_f8 + lVar38 + iVar32);
          puVar44[1] = *(undefined1 *)((long)local_f8 + lVar38 + (long)iVar32 + 1);
          puVar44[2] = *(undefined1 *)((long)local_f8 + lVar38 + (int)uVar35);
          puVar44[3] = *(undefined1 *)((long)local_f8 + lVar38 + (long)(int)uVar35 + 1);
          puVar44[4] = *(undefined1 *)((long)local_f8 + lVar38 + iVar19);
          puVar44[5] = *(undefined1 *)((long)local_f8 + lVar38 + (long)iVar19 + 1);
          puVar44[6] = *(undefined1 *)((long)local_f8 + lVar38 + iVar31);
          puVar44[7] = *(undefined1 *)((long)local_f8 + lVar38 + (long)iVar31 + 1);
          lVar24 = lVar38 + 2;
          iVar33 = (int)lVar38;
          lVar38 = lVar24;
          puVar44 = puVar44 + 8;
        } while (iVar33 + 3 < (int)uVar18);
        puVar44 = puVar39 + 8;
        lVar38 = lVar24 + iVar31;
        lVar37 = lVar24 + iVar19;
        lVar42 = lVar24 + (int)uVar35;
        lVar24 = lVar24 + iVar32;
        uVar10 = uVar18 & 0xfffffffe;
      }
      if ((int)uVar10 < (int)uVar18) {
        lVar27 = 0;
        do {
          puVar44[lVar27 * 4] = *(undefined1 *)((long)local_f8 + lVar27 + lVar24);
          puVar44[lVar27 * 4 + 1] = *(undefined1 *)((long)local_f8 + lVar27 + lVar42);
          puVar44[lVar27 * 4 + 2] = *(undefined1 *)((long)local_f8 + lVar27 + lVar37);
          puVar44[lVar27 * 4 + 3] = *(undefined1 *)((long)local_f8 + lVar27 + lVar38);
          lVar27 = lVar27 + 1;
        } while (uVar18 - uVar10 != (int)lVar27);
      }
      uVar12 = uVar12 + 1;
      pvVar40 = (void *)((long)pvVar40 + local_1c0);
      iVar31 = iVar31 + local_e8._0_4_;
      iVar19 = iVar19 + local_e8._0_4_;
      uVar35 = uVar35 + local_e8._0_4_;
      iVar32 = iVar32 + local_e8._0_4_;
    } while (uVar12 != local_60);
  }
  if ((int)local_70 != (int)local_180) {
    local_1d8 = (undefined1 *)(ulong)(uint)(iVar20 * (int)(float)local_1b8);
    uVar12 = local_70;
    do {
      uVar35 = (uint)uVar12;
      uVar10 = uVar35 + 3;
      if (-1 < (int)uVar35) {
        uVar10 = uVar35;
      }
      puVar44 = (undefined1 *)
                ((long)(int)(((int)uVar10 >> 2) + (uVar35 - (uVar10 & 0xfffffffc))) * local_170 +
                (long)local_178);
      puVar39 = (undefined1 *)
                ((long)(int)(iVar20 * (int)(float)local_1b8 * uVar35) + (long)local_f8);
      if ((int)uVar18 < 2) {
        uVar35 = 0;
      }
      else {
        iVar31 = 1;
        do {
          *puVar44 = *puVar39;
          puVar44[1] = puVar39[1];
          puVar44 = puVar44 + 2;
          puVar39 = puVar39 + 2;
          iVar31 = iVar31 + 2;
          uVar35 = uVar18 & 0xfffffffe;
        } while (iVar31 < (int)uVar18);
      }
      if ((int)uVar35 < (int)uVar18) {
        lVar38 = 0;
        do {
          puVar44[lVar38] = puVar39[lVar38];
          lVar38 = lVar38 + 1;
        } while (uVar18 - uVar35 != (int)lVar38);
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)local_180);
  }
  local_50 = (undefined1 *)(ulong)(uint)fVar9;
  local_48 = pAVar4;
  local_148._0_4_ = fVar22;
  if (0 < (int)fVar22) {
    local_150 = uVar18 & 0xfffffffe;
    uVar12 = 0;
    do {
      uVar47 = 0;
      fVar22 = 0.0;
      if (local_c0 != (void *)0x0) {
        fVar22 = *(float *)((long)local_c0 + uVar12 * 0x10);
      }
      lVar38 = uVar12 * 4 + 1;
      if (local_c0 != (void *)0x0) {
        uVar47 = *(undefined4 *)((long)local_c0 + lVar38 * 4);
      }
      lVar37 = uVar12 * 4 + 2;
      uVar53 = 0;
      uVar54 = 0;
      if (local_c0 != (void *)0x0) {
        uVar54 = *(undefined4 *)((long)local_c0 + lVar37 * 4);
      }
      lVar42 = uVar12 * 4 + 3;
      if (local_c0 != (void *)0x0) {
        uVar53 = *(undefined4 *)((long)local_c0 + lVar42 * 4);
      }
      local_198 = CONCAT44(local_198._4_4_,uVar47);
      sVar2 = local_68->cstep;
      pvVar40 = local_68->data;
      sVar3 = local_68->elemsize;
      puVar39 = (undefined1 *)(uVar12 * 4 * sVar2 * sVar3 + (long)pvVar40);
      puVar44 = (undefined1 *)(sVar2 * lVar38 * sVar3 + (long)pvVar40);
      puVar46 = (undefined1 *)(sVar2 * lVar37 * sVar3 + (long)pvVar40);
      pcVar41 = (char *)(sVar2 * lVar42 * sVar3 + (long)pvVar40);
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_148._0_4_ = pfVar5[uVar12 * 8];
      local_f8 = (void *)CONCAT44(local_f8._4_4_,pfVar5[uVar12 * 8 + 1]);
      local_1dc = pfVar5[lVar42 * 2];
      local_14c = pfVar5[lVar42 * 2 + 1];
      local_168 = (void *)CONCAT44(local_168._4_4_,fVar22);
      local_1a8._0_4_ = uVar53;
      local_e8._0_4_ = uVar54;
      local_138 = CONCAT44(local_138._4_4_,pfVar5[lVar38 * 2]);
      local_108 = CONCAT44(local_108._4_4_,pfVar5[lVar38 * 2 + 1]);
      local_1b8 = CONCAT44(local_1b8._4_4_,pfVar5[lVar37 * 2]);
      local_1b0 = CONCAT44(local_1b0._4_4_,pfVar5[lVar37 * 2 + 1]);
      local_b8 = uVar12;
      if ((int)fVar9 < 4) {
        puVar16 = (undefined1 *)0x0;
      }
      else {
        local_110 = (char *)(local_170 * uVar12 + (long)local_178);
        puVar16 = (undefined1 *)0x0;
        do {
          pvVar13 = (void *)(((ulong)puVar16 >> 2) * local_1c0 + (long)pvVar14);
          local_1f8 = (void *)0x0;
          uStack_1f0 = 0;
          local_a8[8] = 0;
          local_a8[9] = 0;
          local_a8[10] = 0;
          local_a8[0xb] = 0;
          local_a8[4] = 0;
          local_a8[5] = 0;
          local_a8[6] = 0;
          local_a8[7] = 0;
          local_a8[0] = 0;
          local_a8[1] = 0;
          local_a8[2] = 0;
          local_a8[3] = 0;
          pcVar25 = local_110;
          uVar35 = 0;
          if (1 < (int)uVar18) {
            iVar20 = 0;
            do {
              lVar38 = 0;
              do {
                iVar31 = (int)*(char *)((long)pvVar13 + lVar38) * (int)*pcVar25 +
                         *(int *)((long)&local_1f8 + lVar38 * 2);
                *(int *)((long)&local_1f8 + lVar38 * 2) = iVar31;
                *(int *)((long)&local_1f8 + lVar38 * 2) =
                     (int)*(char *)((long)pvVar13 + lVar38 + 1) * (int)pcVar25[1] + iVar31;
                iVar31 = (int)*(char *)((long)pvVar13 + lVar38) * (int)pcVar25[2] +
                         *(int *)((long)local_a8 + lVar38 * 2 + 0x20);
                *(int *)((long)local_a8 + lVar38 * 2 + 0x20) = iVar31;
                *(int *)((long)local_a8 + lVar38 * 2 + 0x20) =
                     (int)*(char *)((long)pvVar13 + lVar38 + 1) * (int)pcVar25[3] + iVar31;
                iVar31 = (int)*(char *)((long)pvVar13 + lVar38) * (int)pcVar25[4] +
                         *(int *)((long)local_a8 + lVar38 * 2 + 0x10);
                *(int *)((long)local_a8 + lVar38 * 2 + 0x10) = iVar31;
                *(int *)((long)local_a8 + lVar38 * 2 + 0x10) =
                     (int)*(char *)((long)pvVar13 + lVar38 + 1) * (int)pcVar25[5] + iVar31;
                iVar31 = (int)*(char *)((long)pvVar13 + lVar38) * (int)pcVar25[6] +
                         *(int *)((long)local_a8 + lVar38 * 2);
                *(int *)((long)local_a8 + lVar38 * 2) = iVar31;
                *(int *)((long)local_a8 + lVar38 * 2) =
                     (int)*(char *)((long)pvVar13 + lVar38 + 1) * (int)pcVar25[7] + iVar31;
                lVar38 = lVar38 + 2;
              } while (lVar38 != 8);
              pcVar25 = pcVar25 + 8;
              pvVar13 = (void *)((long)pvVar13 + 8);
              iVar31 = iVar20 + 3;
              iVar20 = iVar20 + 2;
              uVar35 = local_150;
            } while (iVar31 < (int)uVar18);
          }
          if ((int)uVar35 < (int)uVar18) {
            do {
              lVar38 = 0;
              do {
                piVar1 = (int *)((long)&local_1f8 + lVar38 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar13 + lVar38) * (int)*pcVar25;
                local_a8[lVar38 + 8] =
                     local_a8[lVar38 + 8] + (int)*(char *)((long)pvVar13 + lVar38) * (int)pcVar25[1]
                ;
                local_a8[lVar38 + 4] =
                     local_a8[lVar38 + 4] + (int)*(char *)((long)pvVar13 + lVar38) * (int)pcVar25[2]
                ;
                local_a8[lVar38] =
                     local_a8[lVar38] + (int)*(char *)((long)pvVar13 + lVar38) * (int)pcVar25[3];
                lVar38 = lVar38 + 1;
              } while (lVar38 != 4);
              pcVar25 = pcVar25 + 4;
              pvVar13 = (void *)((long)pvVar13 + 4);
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar18);
          }
          lVar38 = 0;
          local_1d8 = puVar44;
          local_b0 = puVar16;
          do {
            fVar22 = roundf(((float)*(int *)((long)&local_1f8 + lVar38 * 4) * (float)local_148._0_4_
                            + fVar22) * (float)local_f8);
            iVar20 = (int)fVar22;
            if (iVar20 < -0x7e) {
              iVar20 = -0x7f;
            }
            uVar7 = (undefined1)iVar20;
            if (0x7e < iVar20) {
              uVar7 = 0x7f;
            }
            puVar39[lVar38] = uVar7;
            fVar22 = roundf(((float)local_a8[lVar38 + 8] * (float)local_138 + (float)local_198) *
                            (float)local_108);
            iVar20 = (int)fVar22;
            if (iVar20 < -0x7e) {
              iVar20 = -0x7f;
            }
            if (0x7e < iVar20) {
              iVar20 = 0x7f;
            }
            local_1d8[lVar38] = (char)iVar20;
            fVar22 = roundf(((float)local_a8[lVar38 + 4] * (float)local_1b8 + (float)local_e8._0_4_)
                            * (float)local_1b0);
            iVar20 = (int)fVar22;
            if (iVar20 < -0x7e) {
              iVar20 = -0x7f;
            }
            uVar7 = (undefined1)iVar20;
            if (0x7e < iVar20) {
              uVar7 = 0x7f;
            }
            puVar46[lVar38] = uVar7;
            fVar22 = roundf(((float)local_a8[lVar38] * local_1dc + (float)local_1a8._0_4_) *
                            local_14c);
            iVar20 = (int)fVar22;
            if (iVar20 < -0x7e) {
              iVar20 = -0x7f;
            }
            cVar8 = (char)iVar20;
            if (0x7e < iVar20) {
              cVar8 = '\x7f';
            }
            pcVar41[lVar38] = cVar8;
            lVar38 = lVar38 + 1;
            fVar22 = (float)local_168;
          } while (lVar38 != 4);
          puVar39 = puVar39 + 4;
          puVar44 = local_1d8 + 4;
          puVar46 = puVar46 + 4;
          pcVar41 = pcVar41 + 4;
          puVar16 = local_b0 + 4;
          pvVar13 = local_118;
        } while (local_b0 + 7 < local_50);
      }
      if ((int)puVar16 < (int)fVar9) {
        local_58 = (char *)(local_170 * local_b8 + (long)local_178);
        do {
          pcVar17 = (char *)((((uint)puVar16 & 3) + ((uint)((ulong)puVar16 >> 2) & 0x3fffffff)) *
                             local_1c0 + (long)pvVar14);
          iVar20 = 0;
          pcVar25 = local_58;
          if ((int)uVar18 < 2) {
            iVar29 = 0;
            iVar31 = 0;
            iVar19 = 0;
            uVar35 = 0;
          }
          else {
            iVar19 = 0;
            iVar32 = 1;
            iVar31 = 0;
            iVar29 = 0;
            iVar20 = 0;
            do {
              iVar33 = (int)*pcVar17;
              iVar36 = (int)pcVar17[1];
              iVar20 = pcVar25[1] * iVar36 + *pcVar25 * iVar33 + iVar20;
              iVar29 = pcVar25[3] * iVar36 + pcVar25[2] * iVar33 + iVar29;
              iVar31 = pcVar25[5] * iVar36 + pcVar25[4] * iVar33 + iVar31;
              iVar19 = pcVar25[7] * iVar36 + pcVar25[6] * iVar33 + iVar19;
              pcVar25 = pcVar25 + 8;
              pcVar17 = pcVar17 + 2;
              iVar32 = iVar32 + 2;
              uVar35 = local_150;
            } while (iVar32 < (int)uVar18);
          }
          if ((int)uVar35 < (int)uVar18) {
            lVar38 = 0;
            do {
              iVar32 = (int)pcVar17[lVar38];
              iVar20 = iVar20 + pcVar25[lVar38 * 4] * iVar32;
              iVar29 = iVar29 + pcVar25[lVar38 * 4 + 1] * iVar32;
              iVar31 = iVar31 + pcVar25[lVar38 * 4 + 2] * iVar32;
              iVar19 = iVar19 + pcVar25[lVar38 * 4 + 3] * iVar32;
              lVar38 = lVar38 + 1;
            } while (uVar18 - uVar35 != (int)lVar38);
          }
          local_1d8 = puVar44;
          local_110 = pcVar41;
          local_b0 = puVar39;
          local_40 = puVar16;
          local_38 = puVar46;
          fVar22 = roundf(((float)iVar20 * (float)local_148._0_4_ + fVar22) * (float)local_f8);
          puVar39 = local_b0;
          iVar20 = (int)fVar22;
          if (iVar20 < -0x7e) {
            iVar20 = -0x7f;
          }
          uVar7 = (undefined1)iVar20;
          if (0x7e < iVar20) {
            uVar7 = 0x7f;
          }
          *local_b0 = uVar7;
          fVar22 = roundf(((float)iVar29 * (float)local_138 + (float)local_198) * (float)local_108);
          puVar44 = local_1d8;
          iVar20 = (int)fVar22;
          if (iVar20 < -0x7e) {
            iVar20 = -0x7f;
          }
          if (0x7e < iVar20) {
            iVar20 = 0x7f;
          }
          *local_1d8 = (char)iVar20;
          fVar22 = roundf(((float)iVar31 * (float)local_1b8 + (float)local_e8._0_4_) *
                          (float)local_1b0);
          puVar46 = local_38;
          iVar20 = (int)fVar22;
          if (iVar20 < -0x7e) {
            iVar20 = -0x7f;
          }
          if (0x7e < iVar20) {
            iVar20 = 0x7f;
          }
          *local_38 = (char)iVar20;
          fVar22 = roundf(((float)iVar19 * local_1dc + (float)local_1a8._0_4_) * local_14c);
          iVar20 = (int)fVar22;
          if (iVar20 < -0x7e) {
            iVar20 = -0x7f;
          }
          if (0x7e < iVar20) {
            iVar20 = 0x7f;
          }
          *local_110 = (char)iVar20;
          puVar39 = puVar39 + 1;
          puVar44 = puVar44 + 1;
          puVar46 = puVar46 + 1;
          pcVar41 = local_110 + 1;
          fVar11 = (float)((int)local_40 + 1);
          puVar16 = (undefined1 *)(ulong)(uint)fVar11;
          fVar22 = (float)local_168;
        } while (fVar11 != fVar9);
      }
      uVar12 = local_b8 + 1;
    } while (uVar12 != local_60);
  }
  if ((int)local_70 != (int)local_180) {
    local_1b8 = CONCAT44(local_1b8._4_4_,uVar18) & 0xfffffffffffffffe;
    lVar38 = (long)(int)local_70;
    pvVar40 = local_c0;
    do {
      if (pvVar40 == (void *)0x0) {
        auVar48 = ZEXT812(0);
      }
      else {
        auVar48._4_8_ = 0;
        auVar48._0_4_ = *(uint *)((long)pvVar40 + lVar38 * 4);
      }
      auVar52._12_4_ = 0;
      auVar52._0_12_ = auVar48;
      puVar28 = (undefined4 *)(local_68->cstep * lVar38 * local_68->elemsize + (long)local_68->data)
      ;
      uVar12 = 0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar22 = pfVar5[lVar38 * 2];
      local_e8 = ZEXT416((uint)fVar22);
      local_148._0_4_ = pfVar5[lVar38 * 2 + 1];
      local_148._4_12_ = (undefined1  [12])0x0;
      local_1b0 = lVar38;
      local_1a8 = auVar52;
      if (3 < (int)fVar9) {
        uVar35 = (uint)lVar38;
        uVar10 = uVar35 + 3;
        if (-1 < (int)uVar35) {
          uVar10 = uVar35;
        }
        pcVar41 = (char *)((long)(int)(((int)uVar10 >> 2) + (uVar35 - (uVar10 & 0xfffffffc))) *
                           local_170 + (long)local_178);
        local_f8 = (void *)CONCAT44(fVar22,fVar22);
        local_1a8._0_4_ = auVar48._0_4_;
        local_138 = CONCAT44(local_1a8._0_4_,local_1a8._0_4_);
        fStack_130 = (float)local_1a8._0_4_;
        fStack_12c = (float)local_1a8._0_4_;
        local_108 = CONCAT44(local_148._0_4_,local_148._0_4_);
        uVar45 = 0;
        fStack_100 = (float)local_148._0_4_;
        fStack_fc = (float)local_148._0_4_;
        fStack_f0 = fVar22;
        fStack_ec = fVar22;
        do {
          pvVar40 = (void *)((uVar45 >> 2) * local_1c0 + (long)pvVar14);
          uVar35 = 0;
          local_1f8 = (void *)0x0;
          uStack_1f0 = 0;
          pcVar25 = pcVar41;
          if (1 < (int)uVar18) {
            iVar20 = 0;
            do {
              lVar38 = 0;
              do {
                iVar31 = (int)*(char *)((long)pvVar40 + lVar38 * 2) * (int)*pcVar25 +
                         *(int *)((long)&local_1f8 + lVar38 * 4);
                *(int *)((long)&local_1f8 + lVar38 * 4) = iVar31;
                *(int *)((long)&local_1f8 + lVar38 * 4) =
                     (int)*(char *)((long)pvVar40 + lVar38 * 2 + 1) * (int)pcVar25[1] + iVar31;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 4);
              pcVar25 = pcVar25 + 2;
              pvVar40 = (void *)((long)pvVar40 + 8);
              iVar31 = iVar20 + 3;
              iVar20 = iVar20 + 2;
            } while (iVar31 < (int)uVar18);
            uVar35 = (uint)(float)local_1b8;
          }
          if ((int)uVar35 < (int)uVar18) {
            do {
              lVar38 = 0;
              do {
                piVar1 = (int *)((long)&local_1f8 + lVar38 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar40 + lVar38) * (int)*pcVar25;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 4);
              pcVar25 = pcVar25 + 1;
              pvVar40 = (void *)((long)pvVar40 + 4);
              uVar35 = uVar35 + 1;
            } while (uVar35 != uVar18);
          }
          fStack_1d0 = ((float)(int)uStack_1f0 * fStack_f0 + fStack_130) * fStack_100;
          fStack_1cc = ((float)uStack_1f0._4_4_ * fStack_ec + fStack_12c) * fStack_fc;
          local_1d8 = (undefined1 *)
                      CONCAT44(((float)local_1f8._4_4_ * local_f8._4_4_ + local_138._4_4_) *
                               local_108._4_4_,
                               ((float)(int)local_1f8 * (float)local_f8 + (float)local_138) *
                               (float)local_108);
          local_198._0_4_ = roundf(fStack_1cc);
          local_198._4_4_ = extraout_XMM0_Db;
          fVar22 = roundf(fStack_1d0);
          uStack_18c = local_198._4_4_;
          local_198 = CONCAT44((float)local_198,fVar22);
          fVar22 = roundf((float)local_1d8);
          local_168 = (void *)CONCAT44(extraout_XMM0_Db_00,fVar22);
          fVar22 = roundf(local_1d8._4_4_);
          auVar49._0_4_ = (int)(float)local_168;
          auVar49._4_4_ = (int)fVar22;
          auVar49._8_4_ = (int)(float)local_198;
          auVar49._12_4_ = (int)(float)(local_198 >> 0x20);
          auVar51._0_4_ = -(uint)((int)DAT_00187f50 < auVar49._0_4_);
          auVar51._4_4_ = -(uint)(DAT_00187f50._4_4_ < auVar49._4_4_);
          auVar51._8_4_ = -(uint)(DAT_00187f50._8_4_ < auVar49._8_4_);
          auVar51._12_4_ = -(uint)(DAT_00187f50._12_4_ < auVar49._12_4_);
          auVar52 = ~auVar51 & _DAT_00187f50 | auVar49 & auVar51;
          auVar50._0_4_ = -(uint)(auVar52._0_4_ < (int)DAT_00187f60);
          auVar50._4_4_ = -(uint)(auVar52._4_4_ < DAT_00187f60._4_4_);
          auVar50._8_4_ = -(uint)(auVar52._8_4_ < DAT_00187f60._8_4_);
          auVar50._12_4_ = -(uint)(auVar52._12_4_ < DAT_00187f60._12_4_);
          auVar52 = ~auVar50 & _DAT_00187f60 | auVar52 & auVar50;
          auVar52 = packssdw(auVar52,auVar52);
          auVar52 = packsswb(auVar52,auVar52);
          *puVar28 = auVar52._0_4_;
          puVar28 = puVar28 + 1;
          uVar12 = uVar45 + 4;
          puVar44 = (undefined1 *)(uVar45 + 7);
          pvVar40 = local_c0;
          uVar45 = uVar12;
        } while (puVar44 < local_50);
      }
      pvVar23 = local_178;
      if ((int)uVar12 < (int)fVar9) {
        uVar35 = (uint)local_1b0;
        uVar10 = uVar35 + 3;
        if (-1 < (int)uVar35) {
          uVar10 = uVar35;
        }
        lVar38 = (long)(int)(((int)uVar10 >> 2) + (uVar35 - (uVar10 & 0xfffffffc))) * local_170;
        do {
          if ((int)uVar18 < 1) {
            fVar22 = 0.0;
          }
          else {
            lVar37 = 0;
            iVar20 = 0;
            do {
              iVar20 = iVar20 + (int)*(char *)((long)pvVar14 +
                                              lVar37 + (((uint)uVar12 & 3) +
                                                       ((uint)(uVar12 >> 2) & 0x3fffffff)) *
                                                       local_1c0) *
                                (int)*(char *)((long)pvVar23 + lVar37 + lVar38);
              lVar37 = lVar37 + 1;
            } while (uVar18 != (uint)lVar37);
            fVar22 = (float)iVar20;
          }
          fVar22 = roundf((fVar22 * (float)local_e8._0_4_ + (float)local_1a8._0_4_) *
                          (float)local_148._0_4_);
          iVar20 = (int)fVar22;
          if (iVar20 < -0x7e) {
            iVar20 = -0x7f;
          }
          uVar7 = (undefined1)iVar20;
          if (0x7e < iVar20) {
            uVar7 = 0x7f;
          }
          *(undefined1 *)puVar28 = uVar7;
          puVar28 = (undefined4 *)((long)puVar28 + 1);
          fVar22 = (float)((uint)uVar12 + 1);
          uVar12 = (ulong)(uint)fVar22;
        } while (fVar22 != fVar9);
      }
      lVar38 = local_1b0 + 1;
    } while (lVar38 < (long)local_180);
  }
  pAVar4 = local_c8;
  piVar6 = local_120;
  piVar1 = local_128;
  if (local_78 != (int *)0x0) {
    LOCK();
    *local_78 = *local_78 + -1;
    UNLOCK();
    if (*local_78 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_178 != (void *)0x0) {
          free(local_178);
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 0x18))();
      }
    }
  }
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (pAVar4 == (Allocator *)0x0) {
        if (pvVar14 != (void *)0x0) {
          free(pvVar14);
        }
      }
      else {
        (**(code **)(*(long *)pAVar4 + 0x18))(pAVar4,pvVar14);
      }
    }
  }
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_d0 == (Allocator *)0x0) {
        if (pvVar13 != (void *)0x0) {
          free(pvVar13);
        }
      }
      else {
        (**(code **)(*(long *)local_d0 + 0x18))(local_d0,pvVar13);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}